

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree-inl.hh
# Opt level: O0

void __thiscall
phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::Iterator(Iterator *this,Node *n)

{
  pair<phosg::Vector2<long>,_long> local_40;
  Node *local_18;
  Node *n_local;
  Iterator *this_local;
  
  local_18 = n;
  n_local = (Node *)this;
  ::std::
  deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::deque(&this->pending);
  ::std::pair<phosg::Vector2<long>,_long>::pair<phosg::Vector2<long>,_long,_true>(&this->current);
  if (local_18 != (Node *)0x0) {
    ::std::
    deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
    ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*&>
              ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                *)this,&local_18);
    ::std::make_pair<phosg::Vector2<long>&,long&>(&local_40,&local_18->pt,&local_18->value);
    ::std::pair<phosg::Vector2<long>,_long>::operator=(&this->current,&local_40);
  }
  return;
}

Assistant:

KDTree<CoordType, ValueType>::Iterator::Iterator(Node* n) {
  if (n) {
    this->pending.emplace_back(n);
    this->current = std::make_pair(n->pt, n->value);
  }
}